

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O0

Aig_Man_t * Saig_ManFramesBmc(Aig_Man_t *pAig,int nFrames)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *p1;
  int local_40;
  int local_3c;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  iVar2 = Saig_ManRegNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc.c"
                  ,0x36,"Aig_Man_t *Saig_ManFramesBmc(Aig_Man_t *, int)");
  }
  iVar2 = Aig_ManNodeNum(pAig);
  p = Aig_ManStart(iVar2 * nFrames);
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(pAig);
  (pAVar4->field_5).pData = pAVar3;
  for (local_3c = 0; iVar2 = Saig_ManRegNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
    pVVar1 = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pvVar5 = Vec_PtrEntry(pVVar1,local_3c + iVar2);
    pAVar3 = Aig_ManConst0(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_40 = 0; local_40 < nFrames; local_40 = local_40 + 1) {
    for (local_3c = 0; iVar2 = Saig_ManPiNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCis,local_3c);
      pAVar3 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
    }
    for (local_3c = 0; iVar2 = Vec_PtrSize(pAig->vObjs), local_3c < iVar2; local_3c = local_3c + 1)
    {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_3c);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar3), iVar2 != 0)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        p1 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(p,pAVar4,p1);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    for (local_3c = 0; iVar2 = Saig_ManPoNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_3c);
      pAVar3 = Aig_ObjChild0Copy(pAVar3);
      Aig_ObjCreateCo(p,pAVar3);
    }
    if (local_40 == nFrames + -1) break;
    for (local_3c = 0; iVar2 = Saig_ManRegNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
      pVVar1 = pAig->vCos;
      iVar2 = Saig_ManPoNum(pAig);
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_3c + iVar2);
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      (pAVar3->field_5).pData = pAVar4;
    }
    for (local_3c = 0; iVar2 = Saig_ManRegNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
      pAVar3 = Saig_ManLi(pAig,local_3c);
      pAVar4 = Saig_ManLo(pAig,local_3c);
      pAVar4->field_5 = pAVar3->field_5;
    }
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create timeframes of the manager for BMC.]

  Description [The resulting manager is combinational. POs correspond to \
  the property outputs in each time-frame.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Saig_ManFramesBmc( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ManConst0( pFrames );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // create POs for this frame
        Saig_ManForEachPo( pAig, pObj, i )
            Aig_ObjCreateCo( pFrames, Aig_ObjChild0Copy(pObj) );
        if ( f == nFrames - 1 )
            break;
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}